

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

string * __thiscall (anonymous_namespace)::Args::PopFront_abi_cxx11_(Args *this,string_view error)

{
  string *psVar1;
  runtime_error *this_00;
  allocator<char> local_49;
  string_view error_local;
  string local_38 [32];
  
  error_local._M_str = error._M_str;
  error_local._M_len = error._M_len;
  psVar1 = *(string **)this;
  if (psVar1 != *(string **)(this + 8)) {
    *(string **)this = psVar1 + 1;
    return psVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_38,&error_local,&local_49);
  std::runtime_error::runtime_error(this_00,local_38);
  *(undefined ***)this_00 = &PTR__runtime_error_00954e28;
  this_00[0x20] = (runtime_error)0x0;
  __cxa_throw(this_00,&json_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::string& Args::PopFront(cm::string_view error)
{
  if (this->empty()) {
    throw json_error(std::string(error));
  }
  const std::string& res = *this->begin();
  this->advance(1);
  return res;
}